

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_aaa_x86_64(CPUX86State *env)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint local_24;
  int eflags;
  int af;
  int ah;
  int al;
  int icarry;
  CPUX86State *env_local;
  
  uVar1 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  uVar3 = (uint)env->regs[0];
  uVar2 = uVar3 & 0xff;
  eflags = (uint)(env->regs[0] >> 8) & 0xff;
  if (((uVar3 & 0xf) < 10) && ((uVar1 & 0x10) == 0)) {
    local_24 = uVar1 & 0xffffffee;
  }
  else {
    uVar3 = uVar2 + 6;
    eflags = eflags + 1U + (uint)(0xf9 < uVar2) & 0xff;
    local_24 = uVar1 | 0x11;
  }
  af = uVar3 & 0xf;
  env->regs[0] = env->regs[0] & 0xffffffffffff0000 | (long)af | (long)(eflags << 8);
  env->cc_src = (long)(int)local_24;
  return;
}

Assistant:

void helper_aaa(CPUX86State *env)
{
    int icarry;
    int al, ah, af;
    int eflags;

    eflags = cpu_cc_compute_all(env, CC_OP);
    af = eflags & CC_A;
    al = env->regs[R_EAX] & 0xff;
    ah = (env->regs[R_EAX] >> 8) & 0xff;

    icarry = (al > 0xf9);
    if (((al & 0x0f) > 9) || af) {
        al = (al + 6) & 0x0f;
        ah = (ah + 1 + icarry) & 0xff;
        eflags |= CC_C | CC_A;
    } else {
        eflags &= ~(CC_C | CC_A);
        al &= 0x0f;
    }
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | al | (ah << 8);
    CC_SRC = eflags;
}